

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O0

JSON_VALUE * json_parse(char *input)

{
  int iVar1;
  char *pcVar2;
  char *in_RDI;
  char *str_1;
  char *str;
  JSON_VALUE *v;
  char *key;
  int stack_top;
  JSON_VALUE *stack [8];
  size_t len;
  off_t off;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  JSON_TYPE in_stack_ffffffffffffff84;
  off_t local_78;
  JSON_VALUE *p_str;
  off_t off_00;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar3;
  JSON_VALUE *local_58 [8];
  ulong local_18;
  ulong local_10;
  char *local_8;
  
  local_10 = 0;
  iVar3 = 0;
  local_8 = in_RDI;
  local_18 = strlen(in_RDI);
  do {
    if (local_18 <= local_10) {
      return local_58[0];
    }
    p_str = (JSON_VALUE *)0x0;
    off_00 = 0;
    while( true ) {
      while (pcVar2 = strchr(" \t\r\n",(int)local_8[local_10]), pcVar2 != (char *)0x0) {
        local_10 = local_10 + 1;
      }
      iVar1 = (int)local_8[local_10];
      if (iVar1 != 0x22) {
        if (iVar1 == 0x2c) {
          local_10 = local_10 + 1;
          goto LAB_0010366c;
        }
        if (iVar1 == 0x5b) {
          p_str = json_alloc_value(in_stack_ffffffffffffff84);
          local_10 = local_10 + 1;
          goto LAB_0010366c;
        }
        if (iVar1 != 0x5d) {
          if (iVar1 == 0x66) {
            p_str = json_alloc_value(in_stack_ffffffffffffff84);
            local_10 = local_10 + 5;
            goto LAB_0010366c;
          }
          if (iVar1 == 0x6e) {
            p_str = json_alloc_value(in_stack_ffffffffffffff84);
            local_10 = local_10 + 4;
            goto LAB_0010366c;
          }
          if (iVar1 == 0x74) {
            p_str = json_alloc_value(in_stack_ffffffffffffff84);
            local_10 = local_10 + 4;
            goto LAB_0010366c;
          }
          if (iVar1 == 0x7b) {
            p_str = json_alloc_value(in_stack_ffffffffffffff84);
            local_10 = local_10 + 1;
            goto LAB_0010366c;
          }
          if (iVar1 != 0x7d) {
            local_10 = json_create_unqoted_string
                                 ((char *)CONCAT44(iVar3,in_stack_ffffffffffffffa0),off_00,
                                  (char **)p_str);
            p_str = json_alloc_value(in_stack_ffffffffffffff84);
            (p_str->data).str =
                 (char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
            goto LAB_0010366c;
          }
        }
        local_10 = local_10 + 1;
        iVar3 = iVar3 + -1;
        goto LAB_0010366c;
      }
      local_10 = json_create_string((char *)CONCAT44(iVar3,in_stack_ffffffffffffffa0),off_00,
                                    (char **)p_str);
      while (pcVar2 = strchr(" \t\r\n",(int)local_8[local_10]), pcVar2 != (char *)0x0) {
        local_10 = local_10 + 1;
      }
      if (local_8[local_10] != ':') break;
      local_10 = local_10 + 1;
      off_00 = local_78;
    }
    p_str = json_alloc_value(in_stack_ffffffffffffff84);
    *(off_t *)&p_str->data = local_78;
LAB_0010366c:
    while (pcVar2 = strchr(" \t\r\n",(int)local_8[local_10]), pcVar2 != (char *)0x0) {
      local_10 = local_10 + 1;
    }
    if (p_str != (JSON_VALUE *)0x0) {
      if (0 < iVar3) {
        json_add_value((JSON_VALUE *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       (char *)CONCAT44(iVar1,in_stack_ffffffffffffff78),(JSON_VALUE *)0x1036cb);
      }
      if (((p_str->type == JSON_OBJECT) || (p_str->type == JSON_ARRAY)) || (iVar3 == 0)) {
        local_58[iVar3] = p_str;
        iVar3 = iVar3 + 1;
      }
    }
  } while( true );
}

Assistant:

JSON_VALUE*
json_parse(const char* input)
{
    off_t off = 0;
    size_t len;
    JSON_VALUE* stack[8];
    int stack_top = 0;

    len = strlen(input);

    while(off < len) {
        char* key = NULL;
        JSON_VALUE* v = NULL;

after_key:
        while(strchr(" \t\r\n", input[off]) != NULL)
            off++;

        switch(input[off]) {
            case '{':
                v = json_alloc_value(JSON_OBJECT);
                off++;
                break;

            case '[':
                v = json_alloc_value(JSON_ARRAY);
                off++;
                break;

            case 'n':
                v = json_alloc_value(JSON_NULL);
                off += strlen("null");
                break;

            case 'f':
                v = json_alloc_value(JSON_FALSE);
                off += strlen("false");
                break;

            case 't':
                v = json_alloc_value(JSON_TRUE);
                off += strlen("true");
                break;

            case ']':
            case '}':
                off++;
                stack_top--;
                break;

            case ',':
                off++;
                break;

            case '"':
            {
                char* str;

                off = json_create_string(input, off, &str);

                while(strchr(" \t\r\n", input[off]) != NULL)
                    off++;
                if(input[off] == ':') {
                    off++;
                    key = str;
                    goto after_key;
                } else {
                    v = json_alloc_value(JSON_STRING);
                    v->data.str = str;
                }
                break;
            }

            default:
            {
                char* str;

                off = json_create_unqoted_string(input, off, &str);
                v = json_alloc_value(JSON_STRING);
                v->data.str = str;
                break;
            }
        }

        while(strchr(" \t\r\n", input[off]) != NULL)
            off++;

        if(v != NULL) {
            if(stack_top > 0)
                json_add_value(stack[stack_top-1], key, v);

            if(v->type == JSON_OBJECT || v->type == JSON_ARRAY || stack_top == 0) {
                stack[stack_top] = v;
                stack_top++;
            }
        }
    }

    return stack[0];
}